

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::Swap(RepeatedField<float> *this,RepeatedField<float> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_30 [8];
  RepeatedField<float> temp;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    pAVar2 = GetArena(other);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,other);
      return;
    }
    pAVar1 = GetArena(other);
    RepeatedField((RepeatedField<float> *)local_30,pAVar1);
    MergeFrom((RepeatedField<float> *)local_30,this);
    CopyFrom(this,other);
    UnsafeArenaSwap(other,(RepeatedField<float> *)local_30);
    ~RepeatedField((RepeatedField<float> *)local_30);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}